

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_queries.cpp
# Opt level: O2

string * __thiscall
duckdb::PragmaCopyDatabase_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,ClientContext *context,
          FunctionParameters *parameters)

{
  const_reference pvVar1;
  string local_70;
  string local_50;
  string copy_stmt;
  
  ::std::__cxx11::string::string((string *)&copy_stmt,"COPY FROM DATABASE ",(allocator *)&local_70);
  pvVar1 = vector<duckdb::Value,_true>::get<true>((vector<duckdb::Value,_true> *)context,0);
  Value::ToString_abi_cxx11_(&local_50,pvVar1);
  KeywordHelper::WriteOptionallyQuoted(&local_70,&local_50,'\"',true);
  ::std::__cxx11::string::append((string *)&copy_stmt);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::append((char *)&copy_stmt);
  pvVar1 = vector<duckdb::Value,_true>::get<true>((vector<duckdb::Value,_true> *)context,1);
  Value::ToString_abi_cxx11_(&local_50,pvVar1);
  KeywordHelper::WriteOptionallyQuoted(&local_70,&local_50,'\"',true);
  ::std::__cxx11::string::append((string *)&copy_stmt);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::operator+(&local_70,&copy_stmt," (SCHEMA);\n");
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::operator+(&local_70,&copy_stmt," (DATA);");
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&copy_stmt);
  return __return_storage_ptr__;
}

Assistant:

string PragmaCopyDatabase(ClientContext &context, const FunctionParameters &parameters) {
	string copy_stmt = "COPY FROM DATABASE ";
	copy_stmt += KeywordHelper::WriteOptionallyQuoted(parameters.values[0].ToString());
	copy_stmt += " TO ";
	copy_stmt += KeywordHelper::WriteOptionallyQuoted(parameters.values[1].ToString());
	string final_query;
	final_query += copy_stmt + " (SCHEMA);\n";
	final_query += copy_stmt + " (DATA);";
	return final_query;
}